

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

void StoreSideInfo(VP8EncIterator *it)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  int *in_RDI;
  int b;
  uint8_t *info;
  WebPPicture *pic;
  VP8MBInfo *mb;
  VP8Encoder *enc;
  int local_40;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar2 = *(long *)(in_RDI + 10);
  pbVar3 = *(byte **)(in_RDI + 0xc);
  lVar4 = *(long *)(lVar2 + 8);
  if (*(long *)(lVar4 + 0x80) != 0) {
    StoreSSE((VP8EncIterator *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    *(uint *)(lVar2 + 0x5c34) = (uint)((*pbVar3 & 3) == 0) + *(int *)(lVar2 + 0x5c34);
    *(uint *)(lVar2 + 0x5c38) = (uint)((*pbVar3 & 3) == 1) + *(int *)(lVar2 + 0x5c38);
    *(uint *)(lVar2 + 0x5c3c) = (uint)((*pbVar3 >> 4 & 1) != 0) + *(int *)(lVar2 + 0x5c3c);
  }
  if (*(long *)(lVar4 + 0x78) != 0) {
    pbVar5 = (byte *)(*(long *)(lVar4 + 0x78) + (long)(*in_RDI + in_RDI[1] * *(int *)(lVar2 + 0x30))
                     );
    switch(*(undefined4 *)(lVar4 + 0x70)) {
    case 1:
      *pbVar5 = *pbVar3 & 3;
      break;
    case 2:
      *pbVar5 = *pbVar3 >> 5 & 3;
      break;
    case 3:
      *pbVar5 = (byte)*(undefined4 *)(lVar2 + (ulong)(*pbVar3 >> 5 & 3) * 0x2e8 + 0x508);
      break;
    case 4:
      if ((*pbVar3 & 3) == 1) {
        bVar1 = **(byte **)(in_RDI + 0x10);
      }
      else {
        bVar1 = 0xff;
      }
      *pbVar5 = bVar1;
      break;
    case 5:
      *pbVar5 = *pbVar3 >> 2 & 3;
      break;
    case 6:
      local_40 = (int)(*(long *)(in_RDI + 0x4c) + *(long *)(in_RDI + 0x4e) + 7U >> 3);
      if (0xff < local_40) {
        local_40 = 0xff;
      }
      *pbVar5 = (byte)local_40;
      break;
    case 7:
      *pbVar5 = pbVar3[1];
      break;
    default:
      *pbVar5 = 0;
    }
  }
  return;
}

Assistant:

static void StoreSideInfo(const VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc;
  const VP8MBInfo* const mb = it->mb;
  WebPPicture* const pic = enc->pic;

  if (pic->stats != NULL) {
    StoreSSE(it);
    enc->block_count[0] += (mb->type == 0);
    enc->block_count[1] += (mb->type == 1);
    enc->block_count[2] += (mb->skip != 0);
  }

  if (pic->extra_info != NULL) {
    uint8_t* const info = &pic->extra_info[it->x + it->y * enc->mb_w];
    switch (pic->extra_info_type) {
      case 1: *info = mb->type; break;
      case 2: *info = mb->segment; break;
      case 3: *info = enc->dqm[mb->segment].quant; break;
      case 4: *info = (mb->type == 1) ? it->preds[0] : 0xff; break;
      case 5: *info = mb->uv_mode; break;
      case 6: {
        const int b = (int)((it->luma_bits + it->uv_bits + 7) >> 3);
        *info = (b > 255) ? 255 : b; break;
      }
      case 7: *info = mb->alpha; break;
      default: *info = 0; break;
    }
  }
#if SEGMENT_VISU  // visualize segments and prediction modes
  SetBlock(it->yuv_out + Y_OFF_ENC, mb->segment * 64, 16);
  SetBlock(it->yuv_out + U_OFF_ENC, it->preds[0] * 64, 8);
  SetBlock(it->yuv_out + V_OFF_ENC, mb->uv_mode * 64, 8);
#endif
}